

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintgb.h
# Opt level: O1

uint32_t * __thiscall
FastPForLib::VarIntGB<false>::decodeArray
          (VarIntGB<false> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  byte *pbVar1;
  uint32_t *puVar2;
  uint uVar3;
  ushort uVar4;
  uint3 uVar5;
  uint32_t *in_00;
  byte bVar6;
  uint32_t *out_00;
  uint uVar7;
  uint32_t *puVar8;
  uint32_t uVar9;
  byte bVar10;
  bool bVar11;
  
  uVar3 = *in;
  *nvalue = (ulong)uVar3;
  puVar2 = in + length;
  in_00 = in + 1;
  out_00 = out;
  if (5 < (long)length) {
    do {
      in_00 = (uint32_t *)decodeGroupVarInt(this,(uint8_t *)in_00,out_00);
      out_00 = out_00 + 4;
    } while ((uint32_t *)((long)in_00 + 0x11) < puVar2);
  }
  if (in_00 < puVar2) {
    puVar8 = in_00;
    do {
      in_00 = (uint32_t *)((long)puVar8 + 1);
      if (out_00 < out + uVar3) {
        bVar6 = (byte)*puVar8;
        uVar7 = 0;
        do {
          bVar10 = bVar6 & 3;
          uVar9 = (uint32_t)(byte)*in_00;
          if (bVar10 == 0) {
            in_00 = (uint32_t *)((long)in_00 + 1);
          }
          else {
            uVar4 = CONCAT11(*(byte *)((long)in_00 + 1),(byte)*in_00);
            uVar9 = (uint32_t)uVar4;
            if (bVar10 == 1) {
              in_00 = (uint32_t *)((long)in_00 + 2);
            }
            else {
              uVar5 = CONCAT12(*(byte *)((long)in_00 + 2),uVar4);
              uVar9 = (uint32_t)uVar5;
              if (bVar10 == 3) {
                pbVar1 = (byte *)((long)in_00 + 3);
                in_00 = in_00 + 1;
                uVar9 = CONCAT13(*pbVar1,uVar5);
              }
              else {
                in_00 = (uint32_t *)((long)in_00 + 3);
              }
            }
          }
          *out_00 = uVar9;
          out_00 = out_00 + 1;
          if (out + uVar3 <= out_00) break;
          bVar6 = bVar6 >> 2;
          bVar11 = uVar7 < 3;
          uVar7 = uVar7 + 1;
        } while (bVar11);
      }
      puVar8 = in_00;
    } while (in_00 < puVar2);
  }
  return (uint32_t *)((ulong)((long)in_00 + 3) & 0xfffffffffffffffc);
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t length,
                              uint32_t *out, size_t &nvalue) {
    uint32_t prev = 0; // for delta

    const uint8_t *inbyte = reinterpret_cast<const uint8_t *>(in);
    nvalue = *in;
    inbyte += 4;

    const uint8_t *const endbyte =
        reinterpret_cast<const uint8_t *>(in + length);
    const uint32_t *const endout(out + nvalue);
    uint32_t val;

    while (endbyte > inbyte + 1 + 4 * 4) {
      inbyte = delta ? decodeGroupVarIntDelta(inbyte, &prev, out)
                     : decodeGroupVarInt(inbyte, out);
      out += 4;
    }
    while (endbyte > inbyte) {
      uint8_t key = *inbyte++;
      for (int k = 0; out < endout and k < 4; k++) {
        const uint32_t howmanybyte = key & 3;
        key = static_cast<uint8_t>(key >> 2);
        val = static_cast<uint32_t>(*inbyte++);
        if (howmanybyte >= 1) {
          val |= (static_cast<uint32_t>(*inbyte++) << 8);
          if (howmanybyte >= 2) {
            val |= (static_cast<uint32_t>(*inbyte++) << 16);
            if (howmanybyte >= 3) {
              val |= (static_cast<uint32_t>(*inbyte++) << 24);
            }
          }
        }
        prev = (delta ? prev : 0) + val;
        *out++ = prev;
      }
      assert(inbyte <= endbyte);
    }
    inbyte = padTo32bits(inbyte);
    return reinterpret_cast<const uint32_t *>(inbyte);
  }